

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Performance::ConditionalCase::ConditionalCase
          (ConditionalCase *this,Context *context,char *name,char *description,
          DecisionType decisionType,BranchResult branchType,WorkloadDivision workloadDivision,
          bool isVertex)

{
  deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
            ((ShaderPerformanceCase *)this,context->m_testCtx,context->m_renderCtx,name,description,
             (uint)!isVertex);
  (this->super_ControlStatementCase).super_ShaderPerformanceCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ConditionalCase_02129640;
  this->m_decisionType = decisionType;
  this->m_branchType = branchType;
  this->m_workloadDivision = workloadDivision;
  (this->m_comparisonValueArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_comparisonValueArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_comparisonValueArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_comparisonValueArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return;
}

Assistant:

ConditionalCase::ConditionalCase (Context& context, const char* name, const char* description, DecisionType decisionType, BranchResult branchType, WorkloadDivision workloadDivision, bool isVertex)
	: ControlStatementCase			(context.getTestContext(), context.getRenderContext(), name, description, isVertex ? CASETYPE_VERTEX : CASETYPE_FRAGMENT)
	, m_decisionType				(decisionType)
	, m_branchType					(branchType)
	, m_workloadDivision			(workloadDivision)
	, m_arrayBuffer					(0)
{
}